

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_timestamp.cpp
# Opt level: O1

dtime_tz_t duckdb::ParquetIntToTimeNsTZ(int64_t *raw_nanos)

{
  dtime_t dVar1;
  long time_ns;
  
  time_ns = *raw_nanos;
  if (time_ns != 86400000000000) {
    time_ns = time_ns % 86400000000000 + (time_ns % 86400000000000 >> 0x3f & 86400000000000U);
  }
  dVar1 = Time::FromTimeNs(time_ns);
  return (dtime_tz_t)(dVar1.micros << 0x18 | 0xe0ff);
}

Assistant:

dtime_tz_t ParquetIntToTimeNsTZ(const int64_t &raw_nanos) {
	const auto nanos = ParquetWrapTime(raw_nanos, Interval::NANOS_PER_DAY);
	return dtime_tz_t(Time::FromTimeNs(nanos), 0);
}